

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O1

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(Op op,SquareMatrix<double> *A)

{
  long lVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if ((op != NoTrans) && (lVar3 = A->size_, 1 < lVar3)) {
    pdVar4 = (A->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    pdVar6 = pdVar4 + lVar3;
    pdVar4 = pdVar4 + 1;
    lVar7 = 0;
    do {
      lVar8 = 1;
      pdVar5 = pdVar6;
      do {
        dVar2 = pdVar4[lVar8 + -1];
        pdVar4[lVar8 + -1] = *pdVar5;
        *pdVar5 = dVar2;
        lVar1 = lVar7 + lVar8;
        lVar8 = lVar8 + 1;
        pdVar5 = pdVar5 + lVar3;
      } while (lVar1 + 1 < lVar3);
      pdVar4 = pdVar4 + lVar3 + 1;
      pdVar6 = pdVar6 + lVar3 + 1;
      bVar9 = lVar7 != lVar3 + -2;
      lVar7 = lVar7 + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }